

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_cas2_16(void)

{
  uint address;
  uint address_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
    return;
  }
  uVar1 = m68ki_read_imm_32();
  uVar5 = uVar1 >> 0x10 & 7;
  address = m68ki_cpu.dar[uVar1 >> 0x1c];
  uVar2 = m68ki_read_16_fc(address,m68ki_address_space | m68ki_cpu.s_flag);
  uVar6 = uVar2 - (ushort)m68ki_cpu.dar[uVar5];
  uVar4 = (ulong)(uVar1 & 7);
  address_00 = *(uint *)((long)m68ki_cpu.dar + (ulong)(uVar1 >> 10 & 0x3c));
  uVar3 = m68ki_read_16_fc(address_00,m68ki_address_space | m68ki_cpu.s_flag);
  m68ki_cpu.c_flag = uVar6 >> 8;
  m68ki_cpu.not_z_flag = uVar6 & 0xffff;
  m68ki_cpu.v_flag = ((uVar6 ^ uVar2) & (m68ki_cpu.dar[uVar5] ^ uVar2)) >> 8;
  if ((uVar6 & 0xffff) == 0) {
    uVar6 = uVar3 - (m68ki_cpu.dar[uVar4] & 0xffff);
    m68ki_cpu.n_flag = uVar6 >> 8;
    m68ki_cpu.v_flag = ((uVar6 ^ uVar3) & (m68ki_cpu.dar[uVar4] ^ uVar3)) >> 8;
    m68ki_cpu.not_z_flag = uVar6 & 0xffff;
    m68ki_cpu.c_flag = m68ki_cpu.n_flag;
    if (m68ki_cpu.not_z_flag == 0) {
      m68ki_remaining_cycles = m68ki_remaining_cycles + -3;
      m68ki_write_16_fc(address,m68ki_cpu.s_flag | 1,
                        *(uint *)((long)m68ki_cpu.dar + (ulong)(uVar1 >> 0x14 & 0x1c)));
      m68ki_write_16_fc(address_00,m68ki_cpu.s_flag | 1,
                        *(uint *)((long)m68ki_cpu.dar + (ulong)(uVar1 >> 4 & 0x1c)));
      return;
    }
  }
  uVar6 = m68ki_cpu.dar[uVar5] & 0xffff0000 | uVar2;
  if ((int)uVar1 < 0) {
    uVar6 = (int)(short)uVar2;
  }
  m68ki_cpu.n_flag = m68ki_cpu.c_flag;
  m68ki_cpu.dar[uVar5] = uVar6;
  if ((short)uVar1 < 0) {
    uVar3 = (uint)(short)uVar3;
  }
  else {
    uVar3 = (uint)*(ushort *)((long)m68ki_cpu.dar + uVar4 * 4 + 2) << 0x10 | uVar3;
  }
  m68ki_cpu.dar[uVar4] = uVar3;
  return;
}

Assistant:

static void m68k_op_cas2_16(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_32();
		uint* compare1 = &REG_D[(word2 >> 16) & 7];
		uint ea1 = REG_DA[(word2 >> 28) & 15];
		uint dest1 = m68ki_read_16(ea1);
		uint res1 = dest1 - MASK_OUT_ABOVE_16(*compare1);
		uint* compare2 = &REG_D[word2 & 7];
		uint ea2 = REG_DA[(word2 >> 12) & 15];
		uint dest2 = m68ki_read_16(ea2);
		uint res2;

		m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
		FLAG_N = NFLAG_16(res1);
		FLAG_Z = MASK_OUT_ABOVE_16(res1);
		FLAG_V = VFLAG_SUB_16(*compare1, dest1, res1);
		FLAG_C = CFLAG_16(res1);

		if(COND_EQ())
		{
			res2 = dest2 - MASK_OUT_ABOVE_16(*compare2);

			FLAG_N = NFLAG_16(res2);
			FLAG_Z = MASK_OUT_ABOVE_16(res2);
			FLAG_V = VFLAG_SUB_16(*compare2, dest2, res2);
			FLAG_C = CFLAG_16(res2);

			if(COND_EQ())
			{
				USE_CYCLES(3);
				m68ki_write_16(ea1, REG_D[(word2 >> 22) & 7]);
				m68ki_write_16(ea2, REG_D[(word2 >> 6) & 7]);
				return;
			}
		}
        /*
        if (BIT_1F(word2)) {
            *compare1 = (uint)MAKE_INT_16(dest1);
        } else {
            *compare1 = MASK_OUT_BELOW_16(*compare1) | dest1;
        }
        if (BIT_F(word2)) {
            *compare2 = (uint)MAKE_INT_16(dest2);
        } else {
            *compare2 = MASK_OUT_BELOW_16(*compare2) | dest2;
        }
        */
        *compare1 = BIT_1F(word2) ? (uint)MAKE_INT_16(dest1) : MASK_OUT_BELOW_16(*compare1) | dest1;
		*compare2 = BIT_F(word2) ? (uint)MAKE_INT_16(dest2) : MASK_OUT_BELOW_16(*compare2) | dest2;
        return;
	}
	m68ki_exception_illegal();
}